

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# autoutils.c
# Opt level: O2

int ndiffs(double *x,int N,double *alpha,char *test,char *type,int *max_d)

{
  int iVar1;
  double *sig;
  double *oup;
  char *__s;
  uint uVar2;
  size_t __size;
  uint local_3c;
  double local_38;
  
  if (alpha == (double *)0x0) {
    local_38 = 0.05;
  }
  else {
    local_38 = *alpha;
  }
  if (max_d == (int *)0x0) {
    local_3c = 2;
  }
  else {
    local_3c = *max_d;
    if ((int)local_3c < 0) {
      puts("Error. Maximum Difference cannot be less than 0 ");
      exit(-1);
    }
  }
  if (0.01 <= local_38) {
    if (local_38 <= 0.1) goto LAB_0012fcc7;
    local_38 = 0.1;
    __s = "Warning : Alpha only takes values from 0.01 o 0.1. Setting alpha to 0.1. ";
  }
  else {
    local_38 = 0.01;
    __s = "Warning : Alpha only takes values from 0.01 o 0.1. Setting alpha to 0.01. ";
  }
  puts(__s);
LAB_0012fcc7:
  iVar1 = checkConstant(x,N);
  uVar2 = 0;
  if (iVar1 != 1) {
    iVar1 = runstattests(x,N,test,type,local_38);
    __size = (long)N << 3;
    sig = (double *)malloc(__size);
    oup = (double *)malloc(__size);
    memcpy(sig,x,__size);
    uVar2 = 0;
    while( true ) {
      if ((iVar1 == 0) || (local_3c <= uVar2)) goto LAB_0012fd8f;
      N = diff(sig,N,1,oup);
      iVar1 = checkConstant(oup,N);
      if (iVar1 == 1) break;
      iVar1 = runstattests(oup,N,test,type,local_38);
      memcpy(sig,oup,(long)N << 3);
      uVar2 = uVar2 + 1;
    }
    uVar2 = uVar2 + 1;
LAB_0012fd8f:
    free(sig);
    free(oup);
  }
  return uVar2;
}

Assistant:

int ndiffs(double *x, int N,double *alpha, const char *test,const char *type, int *max_d) {
    int d,max_d_,cc,NX,dodiff;
    double alpha_;
    double *y,*z;

    d = 0;

    alpha_ = alpha == NULL ? 0.05 : *alpha;
    max_d_ = max_d == NULL ? 2 : *max_d;

    // printf("%g \n",alpha_);

    if (max_d_ < 0) {
        printf("Error. Maximum Difference cannot be less than 0 \n");
        exit(-1);
    } 

    if (alpha_ < 0.01) {
        alpha_ = 0.01;
        printf("Warning : Alpha only takes values from 0.01 o 0.1. Setting alpha to 0.01. \n");
    }

    if (alpha_ > 0.1) {
        alpha_ = 0.1;
        printf("Warning : Alpha only takes values from 0.01 o 0.1. Setting alpha to 0.1. \n");
    }

    cc = checkConstant(x,N);

    if (cc == 1) return d;

    NX = N;

    dodiff = runstattests(x,N,test,type,alpha_);


    if (dodiff != dodiff) return d;

    y = (double*)malloc(sizeof(double)*NX);
    z = (double*)malloc(sizeof(double)*NX);

    memcpy(y,x,sizeof(double)*NX);

    while (dodiff && d < max_d_) {

        d++;
        //printf("d %d \n",d);

        NX = diff(y,NX,1,z);

        cc = checkConstant(z,NX);

        //printf("cc %d \n",cc);

        if (cc == 1) break;

        dodiff = runstattests(z,NX,test,type,alpha_);

        //printf("dodiff %d \n",dodiff);

        if (dodiff != dodiff) {
            d--;
            break;
        }

        memcpy(y,z,sizeof(double)*NX);
    }

    free(y);
    free(z);

    return d;
}